

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void ga_access_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,AccessIndex *index,
               Integer *ld)

{
  Integer hi [2];
  Integer lo [2];
  Integer *in_stack_000003b0;
  AccessIndex *in_stack_000003b8;
  Integer *in_stack_000003c0;
  Integer *in_stack_000003c8;
  Integer in_stack_000003d0;
  
  pnga_access_idx(in_stack_000003d0,in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,
                  in_stack_000003b0);
  return;
}

Assistant:

void FATR ga_access_(Integer *g_a, Integer *ilo, Integer *ihi,
                     Integer *jlo, Integer *jhi, AccessIndex* index,
                     Integer *ld)
{
    Integer lo[2], hi[2];
    lo[0]=*ilo;
    lo[1]=*jlo;
    hi[0]=*ihi;
    hi[1]=*jhi;
    wnga_access_idx(*g_a, lo, hi, index, ld);
}